

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getclass(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQRESULT SVar3;
  SQObjectPtr *o;
  SQObjectPtr local_18;
  
  o = (SQObjectPtr *)0x0;
  bVar2 = sq_aux_gettypedarg(v,idx,OT_INSTANCE,&o);
  if (bVar2) {
    local_18.super_SQObject._unVal = (SQObjectValue)((o->super_SQObject)._unVal.pClosure)->_root;
    local_18.super_SQObject._type = OT_CLASS;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    SVar3 = 0;
  }
  else {
    SVar3 = -1;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_getclass(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_INSTANCE,o);
    v->Push(SQObjectPtr(_instance(*o)->_class));
    return SQ_OK;
}